

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O3

bool __thiscall QFileDevice::unmap(QFileDevice *this,uchar *address)

{
  QObjectData *pQVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  FileError FVar6;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  iVar5 = (*pQVar1->_vptr_QObjectData[7])(pQVar1);
  if (CONCAT44(extraout_var,iVar5) == 0) {
LAB_00237c89:
    QMetaObject::tr(&local_40,&staticMetaObject,
                    "No file engine available or engine does not support UnMapExtension",(char *)0x0
                    ,-1);
    *(undefined4 *)((long)&pQVar1[5].q_ptr + 4) = 0xd;
  }
  else {
    cVar2 = (**(code **)((pQVar1[4].bindingStorage.bindingStatus)->currentlyEvaluatingBinding[2].
                         alreadyCaptureProperties.super_QVLAStorage<8UL,_8UL,_8LL>.array + 0x28))();
    if (cVar2 == '\0') goto LAB_00237c89;
    QFileDevicePrivate::setError
              ((QFileDevicePrivate *)(this->super_QIODevice).super_QObject.d_ptr.d,NoError);
    bVar3 = QAbstractFileEngine::unmap
                      ((QAbstractFileEngine *)pQVar1[4].bindingStorage.bindingStatus,address);
    bVar4 = true;
    if (bVar3) goto LAB_00237ceb;
    FVar6 = QAbstractFileEngine::error
                      ((QAbstractFileEngine *)pQVar1[4].bindingStorage.bindingStatus);
    QAbstractFileEngine::errorString
              (&local_40,(QAbstractFileEngine *)pQVar1[4].bindingStorage.bindingStatus);
    *(FileError *)((long)&pQVar1[5].q_ptr + 4) = FVar6;
  }
  QString::operator=((QString *)&pQVar1[4].children.d.size,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  bVar4 = false;
LAB_00237ceb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDevice::unmap(uchar *address)
{
    Q_D(QFileDevice);
    if (d->engine()
        && d->fileEngine->supportsExtension(QAbstractFileEngine::UnMapExtension)) {
        unsetError();
        bool success = d->fileEngine->unmap(address);
        if (!success)
            d->setError(d->fileEngine->error(), d->fileEngine->errorString());
        return success;
    }
    d->setError(PermissionsError, tr("No file engine available or engine does not support UnMapExtension"));
    return false;
}